

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O2

double macheps(void)

{
  double dVar1;
  
  for (dVar1 = 1.0; 1.0 < dVar1 + 1.0; dVar1 = dVar1 * 0.5) {
  }
  return dVar1 + dVar1;
}

Assistant:

double macheps() {
	double macheps;
	macheps = 1.0;

	while ((macheps + 1.0) > 1.0) {
		macheps = macheps / 2.0;
	}

	macheps = macheps * 2;

	return macheps;
}